

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_frozen_64(void **param_1)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Roaring64Map *pRVar3;
  bool bVar4;
  size_t size;
  char *buf;
  uint64_t i;
  uint64_t x;
  ulong uVar5;
  Roaring64Map tmp;
  Roaring64Map r1;
  Roaring64Map r2;
  Roaring64Map local_108;
  Roaring64Map local_c8;
  Roaring64Map local_88;
  Roaring64Map local_50;
  
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8.roarings._M_t._M_impl._0_8_ = 0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8.copyOnWrite = false;
  local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  roaring::Roaring64Map::add(&local_c8,0);
  roaring::Roaring64Map::add(&local_c8,0xffffffff);
  roaring::Roaring64Map::add(&local_c8,1000);
  roaring::Roaring64Map::add(&local_c8,2000);
  roaring::Roaring64Map::add(&local_c8,100000);
  roaring::Roaring64Map::add(&local_c8,200000);
  roaring::Roaring64Map::add(&local_c8,5);
  roaring::Roaring64Map::add(&local_c8,1);
  roaring::Roaring64Map::add(&local_c8,2);
  roaring::Roaring64Map::add(&local_c8,0x368d117c00);
  roaring::Roaring64Map::add(&local_c8,0x2d98f13692);
  roaring::Roaring64Map::add(&local_c8,0xc249fdd327780064);
  x = 0xa0064;
  do {
    roaring::Roaring64Map::add(&local_c8,x);
    x = x + 1;
  } while (x != 0xcff9c);
  uVar5 = 0xfffffffffffffffe;
  do {
    roaring::Roaring64Map::add(&local_c8,uVar5 + 0x140002);
    uVar5 = uVar5 + 2;
  } while (uVar5 < 0x2fffe);
  roaring::Roaring64Map::runOptimize(&local_c8);
  size = roaring::Roaring64Map::getFrozenSizeInBytes(&local_c8);
  buf = (char *)roaring_aligned_malloc(0x20,size);
  roaring::Roaring64Map::writeFrozen(&local_c8,buf);
  roaring::Roaring64Map::frozenView(&local_50,buf);
  bVar4 = roaring::Roaring64Map::operator==(&local_c8,&local_50);
  _assert_true((ulong)bVar4,"r1 == r2",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x5a6);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)&local_108,
             (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
              *)&local_50);
  local_108.copyOnWrite = local_50.copyOnWrite;
  bVar4 = roaring::Roaring64Map::operator==(&local_108,&local_c8);
  _assert_true((ulong)bVar4,"tmp == r1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x5ab);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108);
  p_Var1 = &local_108.roarings._M_t._M_impl.super__Rb_tree_header;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108.roarings._M_t._M_impl._0_8_ = 0;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108.copyOnWrite = false;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::operator=((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108,
              (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_50);
  local_108.copyOnWrite = local_50.copyOnWrite;
  bVar4 = roaring::Roaring64Map::operator==(&local_108,&local_c8);
  _assert_true((ulong)bVar4,"tmp == r1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x5b2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108);
  roaring::Roaring64Map::frozenView(&local_108,buf);
  p_Var2 = &local_88.roarings._M_t._M_impl.super__Rb_tree_header;
  if (local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    pRVar3 = &local_88;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         (ulong)(uint)local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  else {
    pRVar3 = &local_108;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var2->_M_header;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  *(size_t *)((long)&(pRVar3->roarings)._M_t._M_impl.super__Rb_tree_header + 0x20) = 0;
  local_88.copyOnWrite = local_108.copyOnWrite;
  bVar4 = roaring::Roaring64Map::operator==(&local_88,&local_c8);
  _assert_true((ulong)bVar4,"b == r1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x5b9);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_88);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108);
  roaring::Roaring64Map::frozenView(&local_108,buf);
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88.roarings._M_t._M_impl._0_8_ = 0;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88.copyOnWrite = false;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
           *)&local_88);
  if (local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var2->_M_header;
    local_88.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_108.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_88.copyOnWrite = local_108.copyOnWrite;
  bVar4 = roaring::Roaring64Map::operator==(&local_88,&local_c8);
  _assert_true((ulong)bVar4,"b == r1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cpp_unit.cpp"
               ,0x5c1);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_88);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_108);
  roaring_aligned_free(buf);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_50);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_c8);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }